

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RK_Individual.cpp
# Opt level: O0

void __thiscall RK_Individual::calculate_fitness(RK_Individual *this,Graph *graph,bool theBest)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  reference ppCVar8;
  iterator __first;
  iterator __last;
  Vertex *pVVar9;
  Edge *this_00;
  double *pdVar10;
  double *pdVar11;
  Vertex *local_b0;
  Vertex *vertex_caps;
  double *losses;
  Vertex *v;
  int id;
  int i_1;
  Edge *e_1;
  Vertex *vertex_1;
  int toInsert_size;
  int inserted_size;
  int local_64;
  Edge *pEStack_60;
  int i;
  Edge *e;
  Vertex *local_48;
  Vertex *vertex;
  Chromosome *chromosome;
  vector<Chromosome_*,_std::allocator<Chromosome_*>_> chromosomes;
  bool theBest_local;
  Graph *graph_local;
  RK_Individual *this_local;
  
  chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = theBest;
  std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::vector
            ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome);
  for (local_48 = Graph::get_verticesList(graph); local_48 != (Vertex *)0x0;
      local_48 = Vertex::getNext(local_48)) {
    for (pEStack_60 = Vertex::getEdgesList(local_48); pEStack_60 != (Edge *)0x0;
        pEStack_60 = Edge::getNext(pEStack_60)) {
      bVar2 = Edge::getModifiable(pEStack_60);
      if ((bVar2) && (bVar2 = Edge::getMarked(pEStack_60), bVar2)) {
        vertex = (Vertex *)operator_new(0x18);
        vertex->id = 0;
        vertex->capacitorMax = 0;
        vertex->nextVertex = (Vertex *)0x0;
        vertex->edgesList = (Edge *)0x0;
        *(Edge **)vertex = pEStack_60;
        vertex->nextVertex = (Vertex *)0x0;
        std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::push_back
                  ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                   (value_type *)&vertex);
      }
    }
  }
  for (local_64 = 0; local_64 < this->number_of_edges; local_64 = local_64 + 1) {
    dVar1 = this->weights[local_64];
    ppCVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::operator[]
                        ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                         (long)local_64);
    (*ppCVar8)->weight = dVar1;
  }
  __first = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::begin
                      ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome);
  __last = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::end
                     ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome);
  std::
  sort<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,bool(*)(Chromosome*,Chromosome*)>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__first._M_current,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__last._M_current,sortChromosome);
  vertex_1._4_4_ = 0;
  iVar3 = Graph::getVerticesSize(graph);
  iVar4 = Graph::getNumberOfNonModifiable(graph);
  for (e_1 = (Edge *)Graph::get_verticesList(graph); e_1 != (Edge *)0x0;
      e_1 = (Edge *)Vertex::getNext((Vertex *)e_1)) {
    for (_id = Vertex::getEdgesList((Vertex *)e_1); _id != (Edge *)0x0; _id = Edge::getNext(_id)) {
      bVar2 = Edge::getModifiable(_id);
      if (bVar2) {
        Edge::setSwitch(_id,false);
      }
      else {
        Edge::setSwitch(_id,true);
      }
      Edge::setActiveFlow(_id,0.0);
      Edge::setReactiveFlow(_id,0.0);
      Edge::setActiveLoss(_id,0.0);
      Edge::setReactiveLoss(_id,0.0);
    }
  }
  Graph::resetIDTree(graph);
  v._4_4_ = 0;
  while (vertex_1._4_4_ < (iVar3 + -1) - iVar4) {
    ppCVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                         (long)v._4_4_);
    pVVar9 = Edge::getOrigin((*ppCVar8)->edge);
    iVar5 = Vertex::getIdTree(pVVar9);
    ppCVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                        ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                         (long)v._4_4_);
    pVVar9 = Edge::getDestiny((*ppCVar8)->edge);
    iVar6 = Vertex::getIdTree(pVVar9);
    if (iVar5 != iVar6) {
      ppCVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                          ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                           (long)v._4_4_);
      bVar2 = Edge::isClosed((*ppCVar8)->edge);
      if (!bVar2) {
        ppCVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                            ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                             (long)v._4_4_);
        pVVar9 = Edge::getOrigin((*ppCVar8)->edge);
        iVar5 = Vertex::getIdTree(pVVar9);
        for (losses = (double *)Graph::get_verticesList(graph); losses != (double *)0x0;
            losses = (double *)Vertex::getNext((Vertex *)losses)) {
          iVar6 = Vertex::getIdTree((Vertex *)losses);
          if (iVar6 == iVar5) {
            ppCVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                                ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                                 (long)v._4_4_);
            pVVar9 = Edge::getDestiny((*ppCVar8)->edge);
            iVar6 = Vertex::getIdTree(pVVar9);
            Vertex::setIdTree((Vertex *)losses,iVar6);
          }
        }
        ppCVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                            ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                             (long)v._4_4_);
        Edge::setSwitch((*ppCVar8)->edge,true);
        ppCVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                            ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                             (long)v._4_4_);
        pVVar9 = Edge::getDestiny((*ppCVar8)->edge);
        iVar5 = Vertex::getID(pVVar9);
        ppCVar8 = std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::at
                            ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome,
                             (long)v._4_4_);
        pVVar9 = Edge::getOrigin((*ppCVar8)->edge);
        iVar6 = Vertex::getID(pVVar9);
        this_00 = Graph::findEdge(graph,iVar5,iVar6);
        Edge::setSwitch(this_00,true);
        vertex_1._4_4_ = vertex_1._4_4_ + 1;
      }
    }
    v._4_4_ = v._4_4_ + 1;
  }
  Graph::defineFlows(graph);
  Graph::capacitor_allocation(graph);
  Graph::evaluateLossesAndFlows(graph,1e-08,0);
  pdVar10 = Graph::getLosses(graph);
  this->active_loss = *pdVar10;
  this->reactive_loss = pdVar10[1];
  uVar7 = std::isnan(*pdVar10);
  if ((uVar7 & 1) != 0) {
    this->active_loss = 9999999999.0;
  }
  uVar7 = std::isnan(pdVar10[1]);
  if ((uVar7 & 1) != 0) {
    this->reactive_loss = 9999999999.0;
  }
  pdVar11 = Graph::getTotalLoss(graph);
  this->objective_function = pdVar11[1];
  uVar7 = std::isnan(this->objective_function);
  if ((uVar7 & 1) != 0) {
    this->objective_function = 9999999999.0;
  }
  if (pdVar10 != (double *)0x0) {
    operator_delete(pdVar10,8);
  }
  if ((chromosomes.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._7_1_ & 1) == 0) {
    for (local_b0 = Graph::get_verticesList(graph); local_b0 != (Vertex *)0x0;
        local_b0 = Vertex::getNext(local_b0)) {
      Vertex::rm_all_capacitors(local_b0);
    }
  }
  std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::clear
            ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome);
  std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>::~vector
            ((vector<Chromosome_*,_std::allocator<Chromosome_*>_> *)&chromosome);
  return;
}

Assistant:

void RK_Individual::calculate_fitness(Graph *graph , bool theBest ){
    vector<Chromosome*> chromosomes;


    Chromosome *chromosome;
    for( Vertex *vertex = graph->get_verticesList(); vertex!=NULL; vertex = vertex->getNext() ){
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e= e->getNext()){
		if(e->getModifiable() == true && e->getMarked() == true){
            chromosome = new Chromosome();
            chromosome->edge = e;
            chromosome->weight = 0;
            chromosomes.push_back(chromosome);
	        }
	}

    }

    for(int i=0; i < this->number_of_edges; i++) /// Copia peso do individio paca cada cromossomo
        chromosomes[i]->weight = this->weights[i];

    sort(chromosomes.begin(), chromosomes.end(), sortChromosome);

    int inserted_size = 0, toInsert_size = graph->getVerticesSize()-1- graph->getNumberOfNonModifiable();


    for(Vertex *vertex = graph->get_verticesList(); vertex!=NULL; vertex = vertex->getNext()){
        for(Edge *e = vertex->getEdgesList(); e!=NULL; e = e->getNext()){

            //arcos nao modificaveis ficam sempre fechados
            if(e->getModifiable() == false)
                e->setSwitch(true);
            else
                e->setSwitch(false);

            e->setActiveFlow(0.0);
            e->setReactiveFlow(0.0);
            e->setActiveLoss(0.0);
            e->setReactiveLoss(0.0);
        }
    }

    graph->resetIDTree();                               // reseta os ids de componentes conexas para algoritmo de Kruskal
    for(int i=0; inserted_size<toInsert_size; i++){     // percorre vetor de cromossomos ordenados e tenta fechar chave(algoritmo de kruskal)
        if( (chromosomes.at(i)->edge->getOrigin()->getIdTree() != chromosomes.at(i)->edge->getDestiny()->getIdTree()) &&
                chromosomes.at(i)->edge->isClosed()==false){
            int id = chromosomes.at(i)->edge->getOrigin()->getIdTree();
            for(Vertex *v = graph->get_verticesList(); v!=NULL; v = v->getNext()){
                if(v->getIdTree()==id)
                    v->setIdTree(chromosomes.at(i)->edge->getDestiny()->getIdTree());
            }
            chromosomes.at(i)->edge->setSwitch(true);
            graph->findEdge(chromosomes.at(i)->edge->getDestiny()->getID(), chromosomes.at(i)->edge->getOrigin()->getID())->setSwitch(true);
            inserted_size++;
        }
    }

    graph->defineFlows();

    graph->capacitor_allocation();          // TODO: trocar calculo da funcao objetivo para o custo total (todos niveis) em dinheiro US$

    graph->evaluateLossesAndFlows(1e-8);    // calcula fluxos e perda com erro de 1e-5

    double *losses = graph->getLosses();    // soma as perdas ativas e reativas em todos os arcos e retorna um double

    this->active_loss           = losses[0];
    this->reactive_loss         = losses[1];

    // No caso de solucoes que possuem configuracao viavel porem sao muito longas
    if( isnan(losses[0]) )      this->active_loss   = 9999999999;
    if( isnan(losses[1]) )      this->reactive_loss = 9999999999;

    this->objective_function    = graph->getTotalLoss()[1];
    if(isnan( this->objective_function ) )    this->objective_function = 9999999999;

//    cout << "Perda Total:    " << graph->getTotalLoss()[0] << endl;
//    cout << "Custo Total:    " << graph->getTotalLoss()[1] << endl;

    delete losses;

    if( !theBest )
    for (Vertex *vertex_caps = graph->get_verticesList(); vertex_caps != NULL; vertex_caps = vertex_caps->getNext()) {
        vertex_caps->rm_all_capacitors();
    }

    chromosomes.clear();    // Deletar vetor de cromossomos(nao esta deletando memoria)
}